

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  char *__s1;
  
  reset(0x800);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "welcome to malloc-simulator(best-fit), enter \'help\' to get some help!",0x45);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  while( true ) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"malloc-simulator$",0x11);
      memset(buffer,0,0x400);
      std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x38);
      std::istream::getline((char *)&std::cin,0x106140,'\0');
      __s1 = strtok(buffer," ");
    } while (__s1 == (char *)0x0);
    iVar1 = strcmp(__s1,"exit");
    if (iVar1 == 0) break;
    iVar1 = strcmp(__s1,"setMemSize");
    if (iVar1 == 0) {
      setMemSize();
    }
    else {
      iVar1 = strcmp(__s1,"showMemInfo");
      if (iVar1 == 0) {
        showMemInfo();
      }
      else {
        iVar1 = strcmp(__s1,"showProcessInfo");
        if (iVar1 == 0) {
          showProcessInfo();
        }
        else {
          iVar1 = strcmp(__s1,"newProcess");
          if (iVar1 == 0) {
            newProcess();
          }
          else {
            iVar1 = strcmp(__s1,"deleteProcess");
            if (iVar1 == 0) {
              deleteProcess();
            }
            else {
              iVar1 = strcmp(__s1,"help");
              if (iVar1 == 0) {
                help();
              }
              else {
                iVar1 = strcmp(__s1,"about");
                if (iVar1 == 0) {
                  about();
                }
                else {
                  iVar1 = strcmp(__s1,"reset");
                  if (iVar1 == 0) {
                    reset(memSize);
                  }
                  else {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"unknown instruction!",0x14);
                    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
                    std::ostream::put('x');
                    std::ostream::flush();
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    // 重置程序
    reset(DEFAULT_MEM_SIZE);

    char *p = NULL;

    cout << WELCOME << endl;

    // 进入主循环
    while (true) {
        cout << PROMPT;
        // 清空缓冲区
        memset(buffer, 0, BUFFER_SIZE);
        // 读入一行
        cin.getline(buffer, BUFFER_SIZE);
        // 分割字符串
        p = strtok(buffer, " ");
        if (p) {
            // 根据不同的指令做不同的事情
            if (!strcmp(p, "exit")) {
                break;
            } else if (!strcmp(p, "setMemSize")) {
                setMemSize();
            } else if (!strcmp(p, "showMemInfo")) {
                showMemInfo();
            } else if (!strcmp(p, "showProcessInfo")) {
                showProcessInfo();
            } else if (!strcmp(p, "newProcess")) {
                newProcess();
            } else if (!strcmp(p, "deleteProcess")) {
                deleteProcess();
            } else if (!strcmp(p, "help")) {
                help();
            } else if (!strcmp(p, "about")) {
                about();
            } else if (!strcmp(p, "reset")) {
                reset(memSize);
            } else {
                cout << "unknown instruction!" << endl;
            }
        }
    }

    return 0;
}